

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_red.c
# Opt level: O0

void ppRedBelt(word *a)

{
  ulong uVar1;
  size_t n;
  size_t mw;
  word *a_local;
  
  n = 4;
  while (uVar1 = n - 1, 1 < uVar1) {
    a[n - 3] = a[uVar1] ^ a[uVar1] << 1 ^ a[uVar1] << 2 ^ a[uVar1] << 7 ^ a[n - 3];
    a[n - 2] = a[uVar1] >> 0x3f ^ a[uVar1] >> 0x3e ^ a[uVar1] >> 0x39 ^ a[n - 2];
    n = uVar1;
  }
  return;
}

Assistant:

void ppRedBelt(word a[])
{
	const size_t mw = W_OF_B(128);
	size_t n = 2 * mw;
	ASSERT(wwIsValid(a, 2 * mw));
	ASSERT(mw * B_PER_W == 128);
	while (--n >= mw)
	{
		a[n - mw] ^= a[n] ^ a[n] << 1 ^ a[n] << 2 ^ a[n] << 7;
		a[n - mw + 1] ^= a[n] >> (B_PER_W - 1) ^
			a[n] >> (B_PER_W - 2) ^ a[n] >> (B_PER_W - 7);
	}
}